

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Grammar.hpp
# Opt level: O0

ATNNode<wchar_t> * __thiscall
Centaurus::Grammar<wchar_t>::resolve(Grammar<wchar_t> *this,ATNPath *path)

{
  int index;
  Identifier *__k;
  mapped_type *this_00;
  ATNNode<wchar_t> *pAVar1;
  ATNPath *path_local;
  Grammar<wchar_t> *this_local;
  
  __k = ATNPath::leaf_id(path);
  this_00 = std::
            unordered_map<Centaurus::Identifier,_Centaurus::ATNMachine<wchar_t>,_std::hash<Centaurus::Identifier>,_std::equal_to<Centaurus::Identifier>,_std::allocator<std::pair<const_Centaurus::Identifier,_Centaurus::ATNMachine<wchar_t>_>_>_>
            ::at(&this->m_networks,__k);
  index = ATNPath::leaf_index(path);
  pAVar1 = ATNMachine<wchar_t>::get_node(this_00,index);
  return pAVar1;
}

Assistant:

const ATNNode<TCHAR>& resolve(const ATNPath& path) const
    {
        return m_networks.at(path.leaf_id()).get_node(path.leaf_index());
    }